

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O2

int coda_time_string_to_parts
              (char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
              int *second,int *musec)

{
  char cVar1;
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  undefined8 uVar4;
  char *message;
  long lVar5;
  undefined1 auVar6 [16];
  
  if (format == (char *)0x0) {
    message = "format argument is NULL (%s:%u)";
    uVar4 = 0x5bc;
  }
  else if (str == (char *)0x0) {
    message = "str argument is NULL (%s:%u)";
    uVar4 = 0x5c1;
  }
  else {
    auVar6._0_4_ = -(uint)(year == (int *)0x0);
    auVar6._4_4_ = -(uint)(month == (int *)0x0);
    auVar6._8_4_ = -(uint)(day == (int *)0x0);
    auVar6._12_4_ = -(uint)(hour == (int *)0x0);
    iVar3 = movmskps(in_EAX,auVar6);
    if ((((iVar3 == 0) && (minute != (int *)0x0)) && (second != (int *)0x0)) &&
       (musec != (int *)0x0)) {
      lVar5 = 0;
      bVar2 = false;
      while( true ) {
        cVar1 = format[lVar5];
        if (cVar1 == '\0') {
          iVar3 = string_to_parts(format,str,year,month,day,hour,minute,second,musec);
          return iVar3;
        }
        if (cVar1 == '|' && !bVar2) break;
        if (cVar1 == '\'') {
          bVar2 = !bVar2;
        }
        lVar5 = lVar5 + 1;
      }
      bVar2 = false;
      iVar3 = 0;
      do {
        iVar3 = string_to_parts(format + iVar3,str,year,month,day,hour,minute,second,musec);
        if (iVar3 == 0) {
          return 0;
        }
        if (format[(int)lVar5] == '\0') {
          coda_set_error(-0x68,"date/time argument (%s) did not match any of the formats (%s)",str,
                         format);
          return -1;
        }
        iVar3 = (int)lVar5 + 1;
        for (lVar5 = (long)iVar3; cVar1 = format[lVar5], cVar1 != '\0'; lVar5 = lVar5 + 1) {
          if (!bVar2 && cVar1 == '|') {
            bVar2 = false;
            break;
          }
          if (cVar1 == '\'') {
            bVar2 = !bVar2;
          }
        }
      } while( true );
    }
    message = "date/time argument(s) are NULL (%s:%u)";
    uVar4 = 0x5c7;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_time_string_to_parts(const char *format, const char *str, int *year, int *month, int *day,
                                          int *hour, int *minute, int *second, int *musec)
{
    int literal = 0;
    int n = 0;

    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (str == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "str argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    while (format[n] != '\0' && (literal || format[n] != '|'))
    {
        if (format[n] == '\'')
        {
            literal = !literal;
        }
        n++;
    }
    if (format[n] == '|')
    {
        int offset = 0;

        /* try multiple formats */
        while (1)
        {
            if (string_to_parts(&format[offset], str, year, month, day, hour, minute, second, musec) == 0)
            {
                /* found a format that works */
                return 0;
            }
            if (format[n] == '\0')
            {
                /* the string matched none of the formats */
                coda_set_error(CODA_ERROR_INVALID_DATETIME,
                               "date/time argument (%s) did not match any of the formats (%s)", str, format);
                return -1;
            }
            n++;
            offset = n;
            while (format[n] != '\0' && (literal || format[n] != '|'))
            {
                if (format[n] == '\'')
                {
                    literal = !literal;
                }
                n++;
            }
        }
    }

    return string_to_parts(format, str, year, month, day, hour, minute, second, musec);
}